

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistoryImpl::clear(UndoHistoryImpl *this)

{
  bool bVar1;
  reference ppVar2;
  long in_RDI;
  pair<long,_const_char_*> elm;
  iterator __end1;
  iterator __begin1;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *__range1;
  _Self *in_stack_ffffffffffffff88;
  _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
  *in_stack_ffffffffffffff90;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
  *in_stack_ffffffffffffffb0;
  _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
  local_30;
  
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::begin
            ((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              *)in_stack_ffffffffffffff88);
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::end
            ((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppVar2 = std::
             _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
             ::operator*(&local_30);
    in_stack_ffffffffffffff90 =
         (_Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
          *)ppVar2->second;
    if (in_stack_ffffffffffffff90 !=
        (_Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
         *)0x0) {
      operator_delete__(in_stack_ffffffffffffff90);
    }
    std::
    _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
    ::operator++(in_stack_ffffffffffffff90);
  }
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::clear
            (in_stack_ffffffffffffffb0);
  *(undefined8 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

void UndoHistoryImpl::clear(void)
{
    for(auto elm : history)
        delete [] elm.second;
    history.clear();
    history_pos = 0;
}